

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

uint32_t __thiscall wasm::EffectAnalyzer::getSideEffects(EffectAnalyzer *this)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  
  bVar2 = (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 |
          this->branchesOut;
  uVar1 = bVar2 + 2;
  if (this->calls == false) {
    uVar1 = (uint)bVar2;
  }
  uVar3 = uVar1 + 4;
  if ((this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 8;
  if ((this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x10;
  if ((this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 0x20;
  if ((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x40;
  if (this->readsMemory == false) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 0x80;
  if (this->writesMemory == false) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x100;
  if (this->readsTable == false) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 0x200;
  if (this->writesTable == false) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x400;
  if (this->implicitTrap == false) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 0x4000;
  if (this->trapsNeverHappen == false) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x800;
  if (this->isAtomic == false) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 0x1000;
  if (this->throws_ == false) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x2000;
  if (this->danglingPop == false) {
    uVar3 = uVar1;
  }
  return uVar3;
}

Assistant:

uint32_t getSideEffects() const {
    uint32_t effects = 0;
    if (branchesOut || hasExternalBreakTargets()) {
      effects |= SideEffects::Branches;
    }
    if (calls) {
      effects |= SideEffects::Calls;
    }
    if (localsRead.size() > 0) {
      effects |= SideEffects::ReadsLocal;
    }
    if (localsWritten.size() > 0) {
      effects |= SideEffects::WritesLocal;
    }
    if (mutableGlobalsRead.size()) {
      effects |= SideEffects::ReadsGlobal;
    }
    if (globalsWritten.size() > 0) {
      effects |= SideEffects::WritesGlobal;
    }
    if (readsMemory) {
      effects |= SideEffects::ReadsMemory;
    }
    if (writesMemory) {
      effects |= SideEffects::WritesMemory;
    }
    if (readsTable) {
      effects |= SideEffects::ReadsTable;
    }
    if (writesTable) {
      effects |= SideEffects::WritesTable;
    }
    if (implicitTrap) {
      effects |= SideEffects::ImplicitTrap;
    }
    if (trapsNeverHappen) {
      effects |= SideEffects::TrapsNeverHappen;
    }
    if (isAtomic) {
      effects |= SideEffects::IsAtomic;
    }
    if (throws_) {
      effects |= SideEffects::Throws;
    }
    if (danglingPop) {
      effects |= SideEffects::DanglingPop;
    }
    return effects;
  }